

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

Reg arm::make_register(RegisterKind k,uint32_t num)

{
  uint32_t num_local;
  RegisterKind k_local;
  Reg local_4;
  
  local_4 = num;
  switch(k) {
  case GeneralPurpose:
    break;
  case DoubleVector:
    local_4 = num + 0x10;
    break;
  case QuadVector:
    local_4 = num + 0x30;
    break;
  case VirtualGeneralPurpose:
    local_4 = num + 0x40;
    break;
  case VirtualDoubleVector:
    local_4 = num + 0x80000000;
    break;
  case VirtualQuadVector:
    local_4 = num + 0xc0000000;
  }
  return local_4;
}

Assistant:

Reg make_register(RegisterKind k, uint32_t num) {
  switch (k) {
    case RegisterKind::GeneralPurpose:
      return num + REG_GP_START;
    case RegisterKind::DoubleVector:
      return num + REG_DOUBLE_START;
    case RegisterKind::QuadVector:
      return num + REG_QUAD_START;
    case RegisterKind::VirtualGeneralPurpose:
      return num + REG_V_GP_START;
    case RegisterKind::VirtualDoubleVector:
      return num + REG_V_DOUBLE_START;
    case RegisterKind::VirtualQuadVector:
      return num + REG_V_QUAD_START;
    default:
      return num;
  }
}